

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O3

CTcCodeLabel * CTcPrsNode::new_label_here(void)

{
  CTcGenTarg *pCVar1;
  CTcCodeLabel *pCVar2;
  
  pCVar1 = G_cg;
  pCVar1->last_op_ = 0xf2;
  pCVar1->second_last_op_ = 0xf2;
  pCVar2 = CTcCodeStream::new_label_here(G_cs);
  return pCVar2;
}

Assistant:

CTcCodeLabel *CTcPrsNode::new_label_here()
{
    /* 
     *   suppress any peephole optimizations at this point -- someone
     *   could jump directly to this instruction, so we can't combine an
     *   instruction destined for this point with anything previous 
     */
    G_cg->clear_peephole();

    /* create and return a label at the current position */
    return G_cs->new_label_here();
}